

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O0

CustomLayerParams_CustomLayerParamValue *
google::protobuf::internal::
MapArenaMessageCreator<CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_false>::
CreateMessage(Arena *arena)

{
  Arena *arena_local;
  CustomLayerParams_CustomLayerParamValue *local_28;
  CustomLayerParams_CustomLayerParamValue *t;
  
  if (arena == (Arena *)0x0) {
    local_28 = (CustomLayerParams_CustomLayerParamValue *)operator_new(0x20);
    CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
    CustomLayerParams_CustomLayerParamValue(local_28);
  }
  else {
    local_28 = (CustomLayerParams_CustomLayerParamValue *)
               Arena::AllocateAligned
                         (arena,(type_info *)
                                &CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
                                 typeinfo,0x20);
    CoreML::Specification::CustomLayerParams_CustomLayerParamValue::
    CustomLayerParams_CustomLayerParamValue(local_28);
    Arena::AddListNode(arena,local_28,
                       arena_destruct_object<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
                      );
  }
  return local_28;
}

Assistant:

static inline Type* CreateMessage(Arena* arena) {
    return Arena::Create<Type>(arena);
  }